

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

int __thiscall Min2<0>::checkSatisfied(Min2<0> *this)

{
  int iVar1;
  int *pt;
  Tchar *pTVar2;
  TrailElem local_18;
  
  if ((this->super_Propagator).satisfied.v != '\0') {
    return 1;
  }
  iVar1 = (((this->z).var)->min).v;
  if ((iVar1 == (((this->x).var)->max).v) || (iVar1 == (((this->y).var)->max).v)) {
    pTVar2 = &(this->super_Propagator).satisfied;
    local_18.x = 0;
    local_18.sz = 1;
    local_18.pt = (int *)pTVar2;
    vec<TrailElem>::push(&engine.trail,&local_18);
    pTVar2->v = '\x01';
  }
  return 3;
}

Assistant:

int checkSatisfied() override {
		if (satisfied) {
			return 1;
		}
		if (z.getMin() == x.getMax() || z.getMin() == y.getMax()) {
			satisfied = true;
		}
		return 3;
	}